

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml.c
# Opt level: O1

LY_ERR lyxml_value_compare(ly_ctx *ctx1,char *value1,void *val_prefix_data1,ly_ctx *ctx2,
                          char *value2,void *val_prefix_data2)

{
  LY_ERR LVar1;
  LY_ERR LVar2;
  int iVar3;
  lys_module *plVar4;
  lys_module *plVar5;
  bool bVar6;
  bool bVar7;
  ly_bool is_prefix1;
  ly_bool is_prefix2;
  uint32_t value1_len;
  uint32_t value2_len;
  char *value1_next;
  char *value2_next;
  ly_bool local_5a;
  ly_bool local_59;
  uint local_58;
  uint local_54;
  char *local_50;
  void *local_48;
  void *local_40;
  char *local_38;
  
  LVar2 = LY_SUCCESS;
  if ((value1 != (char *)0x0 || value2 != (char *)0x0) &&
     (LVar2 = LY_ENOT, (value1 != (char *)0x0) == (value2 != (char *)0x0))) {
    if (ctx2 == (ly_ctx *)0x0) {
      ctx2 = ctx1;
    }
    bVar6 = value1 != (char *)0x0;
    bVar7 = value2 != (char *)0x0;
    LVar1 = LY_SUCCESS;
    if ((bVar6 && bVar7) &&
       (local_48 = val_prefix_data1, local_40 = val_prefix_data2,
       LVar1 = ly_value_prefix_next(value1,(char *)0x0,&local_58,&local_5a,&local_50),
       LVar1 == LY_SUCCESS)) {
      while ((LVar1 = ly_value_prefix_next(value2,(char *)0x0,&local_54,&local_59,&local_38),
             LVar1 == LY_SUCCESS && (LVar1 = LY_ENOT, local_5a == local_59))) {
        if (local_5a == '\0') {
          if (local_58 != local_54) break;
          iVar3 = strncmp(value1,value2,(ulong)local_58);
LAB_001a6d9f:
          if (iVar3 != 0) break;
        }
        else {
          if (local_48 == (void *)0x0) {
            plVar4 = (lys_module *)0x0;
          }
          else {
            plVar4 = ly_resolve_prefix(ctx1,value1,(ulong)local_58,LY_VALUE_XML,local_48);
          }
          if (local_40 == (void *)0x0) {
            plVar5 = (lys_module *)0x0;
          }
          else {
            plVar5 = ly_resolve_prefix(ctx2,value2,(ulong)local_54,LY_VALUE_XML,local_40);
          }
          if ((plVar4 == (lys_module *)0x0) || (plVar5 == (lys_module *)0x0)) break;
          if (plVar4->ctx == plVar5->ctx) {
            if ((plVar4->name != plVar5->name) || (plVar4->revision != plVar5->revision)) break;
          }
          else {
            iVar3 = strcmp(plVar4->name,plVar5->name);
            if (iVar3 != 0) break;
            if (plVar4->revision != (char *)0x0) {
              if (plVar5->revision != (char *)0x0) {
                iVar3 = strcmp(plVar4->revision,plVar5->revision);
                goto LAB_001a6d9f;
              }
              break;
            }
            if (plVar5->revision != (char *)0x0) break;
          }
        }
        value2 = local_38;
        value1 = local_50;
        bVar7 = local_38 != (char *)0x0;
        bVar6 = local_50 != (char *)0x0;
        LVar1 = LY_SUCCESS;
        if ((local_50 == (char *)0x0) ||
           ((LVar1 = LY_SUCCESS, local_38 == (char *)0x0 ||
            (LVar1 = ly_value_prefix_next(local_50,(char *)0x0,&local_58,&local_5a,&local_50),
            LVar1 != LY_SUCCESS)))) break;
      }
    }
    LVar2 = LY_ENOT;
    if (!bVar6 && !bVar7) {
      LVar2 = LVar1;
    }
  }
  return LVar2;
}

Assistant:

LY_ERR
lyxml_value_compare(const struct ly_ctx *ctx1, const char *value1, void *val_prefix_data1,
        const struct ly_ctx *ctx2, const char *value2, void *val_prefix_data2)
{
    const char *value1_iter, *value2_iter;
    const char *value1_next, *value2_next;
    uint32_t value1_len, value2_len;
    ly_bool is_prefix1, is_prefix2;
    const struct lys_module *mod1, *mod2;
    LY_ERR ret;

    if (!value1 && !value2) {
        return LY_SUCCESS;
    }
    if ((value1 && !value2) || (!value1 && value2)) {
        return LY_ENOT;
    }

    if (!ctx2) {
        ctx2 = ctx1;
    }

    ret = LY_SUCCESS;
    for (value1_iter = value1, value2_iter = value2;
            value1_iter && value2_iter;
            value1_iter = value1_next, value2_iter = value2_next) {
        if ((ret = ly_value_prefix_next(value1_iter, NULL, &value1_len, &is_prefix1, &value1_next))) {
            break;
        }
        if ((ret = ly_value_prefix_next(value2_iter, NULL, &value2_len, &is_prefix2, &value2_next))) {
            break;
        }

        if (is_prefix1 != is_prefix2) {
            ret = LY_ENOT;
            break;
        }

        if (!is_prefix1) {
            if (value1_len != value2_len) {
                ret = LY_ENOT;
                break;
            }
            if (strncmp(value1_iter, value2_iter, value1_len)) {
                ret = LY_ENOT;
                break;
            }
            continue;
        }

        mod1 = mod2 = NULL;
        if (val_prefix_data1) {
            /* find module of the first prefix, if any */
            mod1 = ly_resolve_prefix(ctx1, value1_iter, value1_len, LY_VALUE_XML, val_prefix_data1);
        }
        if (val_prefix_data2) {
            mod2 = ly_resolve_prefix(ctx2, value2_iter, value2_len, LY_VALUE_XML, val_prefix_data2);
        }
        if (!mod1 || !mod2) {
            /* not a prefix or maps to different namespaces */
            ret = LY_ENOT;
            break;
        }

        if (mod1->ctx == mod2->ctx) {
            /* same contexts */
            if ((mod1->name != mod2->name) || (mod1->revision != mod2->revision)) {
                ret = LY_ENOT;
                break;
            }
        } else {
            /* different contexts */
            if (strcmp(mod1->name, mod2->name)) {
                ret = LY_ENOT;
                break;
            }

            if (mod1->revision || mod2->revision) {
                if (!mod1->revision || !mod2->revision) {
                    ret = LY_ENOT;
                    break;
                }
                if (strcmp(mod1->revision, mod2->revision)) {
                    ret = LY_ENOT;
                    break;
                }
            }
        }
    }

    if (value1_iter || value2_iter) {
        ret = LY_ENOT;
    }

    return ret;
}